

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGig.c
# Opt level: O0

Gia_Man_t * Gls_ManConstruct(Gls_Man_t *p,char *pFileName)

{
  Vec_Int_t *pVVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  int *piVar6;
  int local_f4;
  word local_e8;
  int *local_e0;
  word local_70;
  word Truth;
  int *pFanins;
  int local_58;
  int Index_1;
  int Limit;
  int iStack_4c;
  char Type;
  int Index;
  int iLit;
  int iObj;
  int k;
  Vec_Int_t *vLeaves;
  Vec_Int_t *vCover;
  Vec_Int_t *vArray;
  Vec_Int_t *vMap;
  Gia_Man_t *pGia;
  char *pFileName_local;
  Gls_Man_t *p_local;
  
  vMap = (Vec_Int_t *)0x0;
  pGia = (Gia_Man_t *)pFileName;
  pFileName_local = (char *)p;
  vLeaves = Vec_IntAlloc(0);
  _iObj = Vec_IntAlloc(6);
  iVar3 = Vec_StrSize(*(Vec_Str_t **)(pFileName_local + 8));
  vMap = (Vec_Int_t *)Gia_ManStart(iVar3);
  pcVar5 = Abc_UtilStrsav((char *)pGia);
  *(char **)vMap = pcVar5;
  piVar6 = (int *)Abc_UtilStrsav((char *)pGia);
  vMap->pArray = piVar6;
  iVar3 = Vec_StrSize(*(Vec_Str_t **)(pFileName_local + 8));
  vArray = Vec_IntStartFull(iVar3);
  Vec_IntWriteEntry(vArray,0,0);
  Vec_IntWriteEntry(vArray,1,1);
  for (iLit = 0; iVar3 = iLit, iVar4 = Vec_IntSize(*(Vec_Int_t **)(pFileName_local + 0x58)),
      iVar3 < iVar4; iLit = iLit + 1) {
    iVar3 = Vec_IntEntry(*(Vec_Int_t **)(pFileName_local + 0x58),iLit);
    pVVar1 = vArray;
    Index = iVar3;
    iVar4 = Gia_ManAppendCi((Gia_Man_t *)vMap);
    Vec_IntWriteEntry(pVVar1,iVar3,iVar4);
  }
  for (iLit = 0; iVar3 = iLit, iVar4 = Vec_IntSize(*(Vec_Int_t **)(pFileName_local + 0x68)),
      iVar3 < iVar4; iLit = iLit + 1) {
    iVar3 = Vec_IntEntry(*(Vec_Int_t **)(pFileName_local + 0x68),iLit);
    pVVar1 = vArray;
    Index = iVar3;
    iVar4 = Gia_ManAppendCi((Gia_Man_t *)vMap);
    Vec_IntWriteEntry(pVVar1,iVar3,iVar4);
  }
  for (Limit = 0; iVar3 = Limit, iVar4 = Vec_IntSize(*(Vec_Int_t **)(pFileName_local + 0x70)),
      iVar3 < iVar4; Limit = Limit + 1) {
    Index = Vec_IntEntry(*(Vec_Int_t **)(pFileName_local + 0x70),Limit);
    iVar3 = Limit;
    iVar4 = Vec_IntEntry(*(Vec_Int_t **)(pFileName_local + 0x10),Index);
    if (iVar3 != iVar4) {
      __assert_fail("Index == Vec_IntEntry(p->vIndexes, iObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGig.c"
                    ,0x195,"Gia_Man_t *Gls_ManConstruct(Gls_Man_t *, char *)");
    }
    vCover = Vec_WecEntry(*(Vec_Wec_t **)(pFileName_local + 0x48),Limit);
    iVar4 = Vec_IntSize(vCover);
    pVVar1 = vArray;
    iVar3 = Index;
    if (iVar4 == 0) {
      iVar4 = Gia_ManAppendCi((Gia_Man_t *)vMap);
      Vec_IntWriteEntry(pVVar1,iVar3,iVar4);
    }
    else {
      for (iLit = 0; iVar3 = iLit, iVar4 = Vec_IntSize(vCover), iVar3 < iVar4; iLit = iLit + 1) {
        iVar3 = Vec_IntEntry(vCover,iLit);
        pVVar1 = vArray;
        Index = iVar3;
        iVar4 = Gia_ManAppendCi((Gia_Man_t *)vMap);
        Vec_IntWriteEntry(pVVar1,iVar3,iVar4);
      }
    }
  }
  for (Limit = 0; iVar3 = Limit, iVar4 = Vec_IntSize(*(Vec_Int_t **)(pFileName_local + 0x78)),
      iVar3 < iVar4; Limit = Limit + 1) {
    Index = Vec_IntEntry(*(Vec_Int_t **)(pFileName_local + 0x78),Limit);
    Index_1._3_1_ = Vec_StrEntry(*(Vec_Str_t **)(pFileName_local + 8),Index);
    pVVar1 = vArray;
    if ((Index_1._3_1_ == '\a') || (Index_1._3_1_ == '\b')) {
      local_58 = 6;
      if (Index_1._3_1_ == '\a') {
        local_58 = 4;
      }
      pFanins._4_4_ = Vec_IntEntry(*(Vec_Int_t **)(pFileName_local + 0x10),Index);
      if (Index_1._3_1_ == '\a') {
        local_e0 = Vec_IntEntryP(*(Vec_Int_t **)(pFileName_local + 0x18),pFanins._4_4_ << 2);
      }
      else {
        local_e0 = Vec_IntEntryP(*(Vec_Int_t **)(pFileName_local + 0x28),pFanins._4_4_ * 6);
      }
      Truth = (word)local_e0;
      if (Index_1._3_1_ == '\a') {
        iVar3 = Vec_IntEntry(*(Vec_Int_t **)(pFileName_local + 0x20),pFanins._4_4_);
        local_e8 = (word)iVar3;
      }
      else {
        local_e8 = Vec_WrdEntry(*(Vec_Wrd_t **)(pFileName_local + 0x30),pFanins._4_4_);
      }
      local_70 = local_e8;
      Vec_IntClear(_iObj);
      for (iLit = 0; pVVar2 = vMap, pVVar1 = _iObj, iLit < local_58; iLit = iLit + 1) {
        if (*(int *)(Truth + (long)iLit * 4) == -1) {
          local_f4 = 0;
        }
        else {
          local_f4 = Vec_IntEntry(vArray,*(int *)(Truth + (long)iLit * 4));
        }
        Vec_IntPush(pVVar1,local_f4);
      }
      iVar3 = Vec_IntSize(_iObj);
      iStack_4c = Kit_TruthToGia((Gia_Man_t *)pVVar2,(uint *)&local_70,iVar3,vLeaves,_iObj,0);
      Vec_IntWriteEntry(vArray,Index,iStack_4c);
    }
    else if ((Index_1._3_1_ == '\x04') || (Index_1._3_1_ == '\x06')) {
      iVar3 = Vec_IntEntry(*(Vec_Int_t **)(pFileName_local + 0x10),Index);
      iStack_4c = Vec_IntEntry(pVVar1,iVar3);
      Vec_IntWriteEntry(vArray,Index,iStack_4c);
    }
  }
  Limit = 0;
  while( true ) {
    iVar3 = Limit;
    iVar4 = Vec_IntSize(*(Vec_Int_t **)(pFileName_local + 0x70));
    if (iVar4 <= iVar3) {
      for (iLit = 0; iVar3 = iLit, iVar4 = Vec_IntSize(*(Vec_Int_t **)(pFileName_local + 0x60)),
          iVar3 < iVar4; iLit = iLit + 1) {
        Index = Vec_IntEntry(*(Vec_Int_t **)(pFileName_local + 0x60),iLit);
        pVVar2 = vMap;
        pVVar1 = vArray;
        iVar3 = Vec_IntEntry(*(Vec_Int_t **)(pFileName_local + 0x10),Index);
        iVar3 = Vec_IntEntry(pVVar1,iVar3);
        Gia_ManAppendCo((Gia_Man_t *)pVVar2,iVar3);
      }
      for (iLit = 0; iVar3 = iLit, iVar4 = Vec_IntSize(*(Vec_Int_t **)(pFileName_local + 0x80)),
          iVar3 < iVar4; iLit = iLit + 1) {
        Index = Vec_IntEntry(*(Vec_Int_t **)(pFileName_local + 0x80),iLit);
        pVVar2 = vMap;
        pVVar1 = vArray;
        iVar3 = Vec_IntEntry(*(Vec_Int_t **)(pFileName_local + 0x10),Index);
        iVar3 = Vec_IntEntry(pVVar1,iVar3);
        Gia_ManAppendCo((Gia_Man_t *)pVVar2,iVar3);
      }
      Vec_IntFree(vArray);
      Vec_IntFree(vLeaves);
      Vec_IntFree(_iObj);
      return (Gia_Man_t *)vMap;
    }
    Index = Vec_IntEntry(*(Vec_Int_t **)(pFileName_local + 0x70),Limit);
    vCover = Vec_WecEntry(*(Vec_Wec_t **)(pFileName_local + 0x40),Limit);
    iVar3 = Vec_IntSize(vCover);
    if (iVar3 < 1) break;
    for (iLit = 0; iVar3 = iLit, iVar4 = Vec_IntSize(vCover), iVar3 < iVar4; iLit = iLit + 1) {
      Index = Vec_IntEntry(vCover,iLit);
      pVVar1 = vMap;
      iVar3 = Vec_IntEntry(vArray,Index);
      Gia_ManAppendCo((Gia_Man_t *)pVVar1,iVar3);
    }
    Limit = Limit + 1;
  }
  __assert_fail("Vec_IntSize(vArray) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGig.c"
                ,0x1b7,"Gia_Man_t *Gls_ManConstruct(Gls_Man_t *, char *)");
}

Assistant:

Gia_Man_t * Gls_ManConstruct( Gls_Man_t * p, char * pFileName )
{
    extern int Kit_TruthToGia( Gia_Man_t * pMan, unsigned * pTruth, int nVars, Vec_Int_t * vMemory, Vec_Int_t * vLeaves, int fHash );
    Gia_Man_t * pGia = NULL;  
    Vec_Int_t * vMap, * vArray;
    Vec_Int_t * vCover = Vec_IntAlloc(0);
    Vec_Int_t * vLeaves = Vec_IntAlloc(6);
    int  k, iObj, iLit, Index;  char Type;
    // create new manager
    pGia = Gia_ManStart( Vec_StrSize(p->vTypes) );
    pGia->pName = Abc_UtilStrsav( pFileName );
    pGia->pSpec = Abc_UtilStrsav( pFileName );
    // create constants
    vMap = Vec_IntStartFull( Vec_StrSize(p->vTypes) );
    Vec_IntWriteEntry( vMap, 0, 0 );
    Vec_IntWriteEntry( vMap, 1, 1 );
    // create primary inputs
    Vec_IntForEachEntry( p->vOrderPis, iObj, k )
        Vec_IntWriteEntry( vMap, iObj, Gia_ManAppendCi(pGia) );
    // create box outputs
    Vec_IntForEachEntry( p->vOrderBoxes, iObj, k )
        Vec_IntWriteEntry( vMap, iObj, Gia_ManAppendCi(pGia) );
    // create delay outputs
    Vec_IntForEachEntry( p->vOrderDelays, iObj, Index )
    {
        assert( Index == Vec_IntEntry(p->vIndexes, iObj) );
        vArray = Vec_WecEntry(p->vDelayOuts, Index);
        if ( Vec_IntSize(vArray) == 0 )
            Vec_IntWriteEntry( vMap, iObj, Gia_ManAppendCi(pGia) );
        else
            Vec_IntForEachEntry( vArray, iObj, k )
                Vec_IntWriteEntry( vMap, iObj, Gia_ManAppendCi(pGia) );
    }
    // construct LUTs
    Vec_IntForEachEntry( p->vOrderLuts, iObj, Index )
    {
        Type = Vec_StrEntry( p->vTypes, iObj );
        if ( Type == GLS_LUT4 || Type == GLS_LUT6 )
        {
            int Limit = Type == GLS_LUT4 ? 4 : 6;
            int Index = Vec_IntEntry(p->vIndexes, iObj);
            int * pFanins = Type == GLS_LUT4 ? Vec_IntEntryP(p->vLut4s, 4*Index) : Vec_IntEntryP(p->vLut6s, 6*Index);
            word Truth = Type == GLS_LUT4 ? (word)Vec_IntEntry(p->vLut4TTs, Index) : Vec_WrdEntry(p->vLut6TTs, Index);
            Vec_IntClear( vLeaves );
            for ( k = 0; k < Limit; k++ )
                Vec_IntPush( vLeaves, pFanins[k] == GLS_NONE ? 0 : Vec_IntEntry(vMap, pFanins[k]) );
            iLit = Kit_TruthToGia( pGia, (unsigned *)&Truth, Vec_IntSize(vLeaves), vCover, vLeaves, 0 );
            Vec_IntWriteEntry( vMap, iObj, iLit );
        }
        else if ( Type == GLS_BAR || Type == GLS_SEL )
        {
            iLit = Vec_IntEntry( vMap, Vec_IntEntry(p->vIndexes, iObj) );
            Vec_IntWriteEntry( vMap, iObj, iLit );
        }
    }
    // delay inputs
    Vec_IntForEachEntry( p->vOrderDelays, iObj, Index )
    {
        vArray = Vec_WecEntry(p->vDelayIns, Index);
        assert( Vec_IntSize(vArray) > 0 );
        Vec_IntForEachEntry( vArray, iObj, k )
            Gia_ManAppendCo( pGia, Vec_IntEntry(vMap, iObj) );
    }
    // create primary outputs
    Vec_IntForEachEntry( p->vOrderPos, iObj, k )
        Gia_ManAppendCo( pGia, Vec_IntEntry(vMap, Vec_IntEntry(p->vIndexes, iObj)) );
    // create sequential nodes
    Vec_IntForEachEntry( p->vOrderSeqs, iObj, k )
        Gia_ManAppendCo( pGia, Vec_IntEntry(vMap, Vec_IntEntry(p->vIndexes, iObj)) );
    Vec_IntFree( vMap );
    Vec_IntFree( vCover );
    Vec_IntFree( vLeaves );
    // print delay boxes
//    for ( k = 0; k < Vec_IntSize(p->vDelays); k++ )
//        printf( "%d:%d  ", Vec_IntSize(Vec_WecEntry(p->vDelayIns, k)), Vec_IntSize(Vec_WecEntry(p->vDelayOuts, k)) );
//    printf( "\n" );
    return pGia;
}